

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_MeshTopology::Dump(ON_MeshTopology *this,ON_TextLog *dump)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ON_MeshTopologyVertex *pOVar6;
  ON_3fPoint *pOVar7;
  ON_MeshTopologyEdge *pOVar8;
  ON_MeshTopologyFace *pOVar9;
  char local_61;
  ON_MeshTopologyFace *f;
  ON_MeshTopologyEdge *e;
  ON_MeshTopologyVertex *v;
  int topf_count;
  int tope_count;
  int topv_count;
  int j;
  int fi;
  int ei;
  int vi;
  ON_3fPoint p;
  ON_TextLog *dump_local;
  ON_MeshTopology *this_local;
  
  iVar3 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv);
  iVar4 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&this->m_tope);
  iVar5 = ON_SimpleArray<ON_MeshTopologyFace>::Count(&this->m_topf);
  for (fi = 0; fi < iVar3; fi = fi + 1) {
    pOVar6 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,fi);
    ON_TextLog::Print(dump,"topv %d: ",(ulong)(uint)fi);
    if (this->m_mesh != (ON_Mesh *)0x0) {
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,*pOVar6->m_vi);
      uVar1 = pOVar7->x;
      uVar2 = pOVar7->y;
      ON_TextLog::Print(dump,"{%g,%g,%g} ",(double)(float)uVar1,(double)(float)uVar2,
                        (double)pOVar7->z);
    }
    ON_TextLog::Print(dump,"(");
    for (tope_count = 0; tope_count < pOVar6->m_v_count; tope_count = tope_count + 1) {
      if (tope_count != 0) {
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"m_V[%d]",(ulong)(uint)pOVar6->m_vi[tope_count]);
    }
    ON_TextLog::Print(dump,") (");
    for (tope_count = 0; tope_count < pOVar6->m_tope_count; tope_count = tope_count + 1) {
      if (tope_count != 0) {
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"%d",(ulong)(uint)pOVar6->m_topei[tope_count]);
    }
    ON_TextLog::Print(dump,")\n");
  }
  for (j = 0; j < iVar4; j = j + 1) {
    pOVar8 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,j);
    ON_TextLog::Print(dump,"tope %d: topv%d to topvv%d (",(ulong)(uint)j,
                      (ulong)(uint)pOVar8->m_topvi[0],(ulong)(uint)pOVar8->m_topvi[1]);
    for (tope_count = 0; tope_count < pOVar8->m_topf_count; tope_count = tope_count + 1) {
      if (tope_count != 0) {
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"f%d",(ulong)(uint)pOVar8->m_topfi[tope_count]);
    }
    ON_TextLog::Print(dump,")\n");
  }
  for (topv_count = 0; topv_count < iVar5; topv_count = topv_count + 1) {
    pOVar9 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&this->m_topf,topv_count);
    ON_TextLog::Print(dump,"topf %d: (",(ulong)(uint)topv_count);
    tope_count = 0;
    while ((tope_count < 4 && ((tope_count != 3 || (pOVar9->m_topei[3] != pOVar9->m_topei[2]))))) {
      if (tope_count != 0) {
        ON_TextLog::Print(dump,",");
      }
      local_61 = '-';
      if (pOVar9->m_reve[tope_count] == '\0') {
        local_61 = '+';
      }
      ON_TextLog::Print(dump,"%ce%d",(ulong)(uint)(int)local_61,
                        (ulong)(uint)pOVar9->m_topei[tope_count]);
      tope_count = tope_count + 1;
    }
    ON_TextLog::Print(dump,")\n");
  }
  return;
}

Assistant:

void ON_MeshTopology::Dump( ON_TextLog& dump ) const
{
  ON_3fPoint p;
  int vi, ei, fi, j;
  const int topv_count = m_topv.Count();
  const int tope_count = m_tope.Count();
  const int topf_count = m_topf.Count();

  // topological vertex information
  for ( vi = 0; vi < topv_count; vi++ ) {
    const ON_MeshTopologyVertex& v = m_topv[vi];
    dump.Print("topv %d: ",vi);
    if (m_mesh) {
      // dump geometric location of this vertex
      p = m_mesh->m_V[v.m_vi[0]];
      dump.Print("{%g,%g,%g} ", p.x, p.y, p.z);
    }

    // list all mesh geometry vertices that are coincident with this
    // topological vertex
    dump.Print("(");
    for ( j = 0; j < v.m_v_count; j++ ) {
      if ( j )
        dump.Print(",");
      dump.Print("m_V[%d]",v.m_vi[j]);
    }

    // list all topological edges that begin/end at this topological vertex
    dump.Print(") (");
    for ( j = 0; j < v.m_tope_count; j++ ) {
      if ( j )
        dump.Print(",");
      dump.Print("%d",v.m_topei[j]);
    }
    dump.Print(")\n");
  }

  // topological edge information
  for ( ei = 0; ei < tope_count; ei++ ) {
    const ON_MeshTopologyEdge& e = m_tope[ei];
    dump.Print("tope %d: topv%d to topvv%d (", ei, e.m_topvi[0], e.m_topvi[1] );
    // list all mesh topological faces attached to this topological edge
    for ( j = 0; j < e.m_topf_count; j++ ) {
      if (j)
        dump.Print(",");
      dump.Print("f%d",e.m_topfi[j]);
    }
    dump.Print(")\n");
  }

  // topological face information
  // mesh m_F[] index = mesh topology m_topf[] index
  for ( fi = 0; fi < topf_count; fi++ ) {
    const ON_MeshTopologyFace& f = m_topf[fi];
    dump.Print("topf %d: (",fi);
    for ( j = 0; j < 4; j++ ) {
      if ( j == 3 && f.m_topei[3] == f.m_topei[2] )
        break; // triangular face
      if (j)
        dump.Print(",");
      dump.Print("%ce%d",f.m_reve[j]?'-':'+',f.m_topei[j]);
    }
    dump.Print(")\n");
  }
}